

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# party.cpp
# Opt level: O2

void __thiscall Party::UpdateHP(Party *this,Character *character)

{
  pointer ppCVar1;
  int iVar2;
  int iVar3;
  uchar num;
  pointer ppCVar4;
  PacketBuilder builder;
  
  PacketBuilder::PacketBuilder(&builder,PACKET_PARTY,PACKET_AGREE,3);
  PacketBuilder::AddShort(&builder,(unsigned_short)character->player->id);
  iVar2 = (int)(((double)(int)character->hp / (double)(int)character->maxhp) * 100.0);
  iVar3 = 0;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  num = 'd';
  if (iVar3 < 100) {
    num = (uchar)iVar3;
  }
  PacketBuilder::AddChar(&builder,num);
  ppCVar1 = (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar4 = (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppCVar4 != ppCVar1; ppCVar4 = ppCVar4 + 1
      ) {
    Character::Send(*ppCVar4,&builder);
  }
  PacketBuilder::~PacketBuilder(&builder);
  return;
}

Assistant:

void Party::UpdateHP(Character *character)
{
	PacketBuilder builder(PACKET_PARTY, PACKET_AGREE, 3);
	builder.AddShort(character->PlayerID());
	builder.AddChar(util::clamp<int>(double(character->hp) / double(character->maxhp) * 100.0, 0, 100));

	UTIL_FOREACH(this->members, member)
	{
		member->Send(builder);
	}
}